

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O2

bool slang::syntax::SyntaxFacts::isPossibleArgument(TokenKind kind)

{
  int iVar1;
  bool bVar2;
  undefined6 in_register_0000003a;
  
  iVar1 = (int)CONCAT62(in_register_0000003a,kind);
  if (((((0x3a < iVar1 - 0xecU) ||
        ((0x604000700400001U >> ((ulong)(iVar1 - 0xecU) & 0x3f) & 1) == 0)) &&
       ((0x3f < iVar1 - 0xa3U || ((0x8900000000080041U >> ((ulong)(iVar1 - 0xa3U) & 0x3f) & 1) == 0)
        ))) && (((0x2f < iVar1 - 0x5dU ||
                 ((0x800000400005U >> ((ulong)(iVar1 - 0x5dU) & 0x3f) & 1) == 0)) &&
                (1 < iVar1 - 0x18U)))) && (iVar1 != 0x14a)) {
    bVar2 = isPossibleExpression(kind);
    return bVar2;
  }
  return true;
}

Assistant:

bool SyntaxFacts::isPossibleArgument(TokenKind kind) {
    // allow a comma here to handle cases like:  foo(, 3);
    switch (kind) {
        case TokenKind::Dot:
        case TokenKind::Comma:
        case TokenKind::FirstMatchKeyword:
        case TokenKind::StrongKeyword:
        case TokenKind::WeakKeyword:
        case TokenKind::NotKeyword:
        case TokenKind::IfKeyword:
        case TokenKind::CaseKeyword:
        case TokenKind::NextTimeKeyword:
        case TokenKind::SNextTimeKeyword:
        case TokenKind::AlwaysKeyword:
        case TokenKind::SAlwaysKeyword:
        case TokenKind::EventuallyKeyword:
        case TokenKind::SEventuallyKeyword:
        case TokenKind::AcceptOnKeyword:
        case TokenKind::SyncAcceptOnKeyword:
        case TokenKind::RejectOnKeyword:
        case TokenKind::SyncRejectOnKeyword:
        case TokenKind::EdgeKeyword:
        case TokenKind::PosEdgeKeyword:
        case TokenKind::NegEdgeKeyword:
            return true;
        default:
            return isPossibleExpression(kind);
    }
}